

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_package.c
# Opt level: O3

int lj_cf_package_loadlib(lua_State *L)

{
  TValue TVar1;
  int iVar2;
  char *pcVar3;
  char *name;
  TValue *pTVar4;
  int iVar5;
  
  iVar5 = 1;
  pcVar3 = luaL_checklstring(L,1,(size_t *)0x0);
  name = luaL_checklstring(L,2,(size_t *)0x0);
  iVar2 = ll_loadfunc(L,pcVar3,name,1);
  if (iVar2 != 0) {
    (L->top->field_2).it = 0xffffffff;
    pTVar4 = L->top + 1;
    L->top = pTVar4;
    if ((TValue *)(ulong)(L->maxstack).ptr32 <= pTVar4) {
      lj_state_growstack(L,1);
      pTVar4 = L->top;
    }
    TVar1 = pTVar4[-1];
    pTVar4[-1] = pTVar4[-2];
    *pTVar4 = TVar1;
    pTVar4[-2] = *L->top;
    pcVar3 = "init";
    if (iVar2 == 1) {
      pcVar3 = "open";
    }
    lua_pushstring(L,pcVar3);
    iVar5 = 3;
  }
  return iVar5;
}

Assistant:

static int lj_cf_package_loadlib(lua_State *L)
{
  const char *path = luaL_checkstring(L, 1);
  const char *init = luaL_checkstring(L, 2);
  int st = ll_loadfunc(L, path, init, 1);
  if (st == 0) {  /* no errors? */
    return 1;  /* return the loaded function */
  } else {  /* error; error message is on stack top */
    lua_pushnil(L);
    lua_insert(L, -2);
    lua_pushstring(L, (st == PACKAGE_ERR_LIB) ?  PACKAGE_LIB_FAIL : "init");
    return 3;  /* return nil, error message, and where */
  }
}